

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

bool __thiscall Chainstate::ReplayBlocks(Chainstate *this)

{
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view logging_function_06;
  bool bVar1;
  undefined1 uVar2;
  DisconnectResult DVar3;
  CCoinsViewCache *pCVar4;
  size_type sVar5;
  Notifications *pNVar6;
  char *pcVar7;
  size_type sVar8;
  char *pcVar9;
  mapped_type *pmVar10;
  CBlockIndex *args_1;
  ConstevalStringLiteral str;
  long in_RDI;
  long in_FS_OFFSET;
  CBlockIndex *pindex;
  int nForkHeight;
  DisconnectResult res;
  CBlockIndex *pindexFork;
  CBlockIndex *pindexNew;
  CBlockIndex *pindexOld;
  CCoinsView *db;
  int nHeight;
  vector<uint256,_std::allocator<uint256>_> hashHeads;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock36;
  CBlock block;
  CCoinsViewCache cache;
  undefined4 in_stack_fffffffffffff908;
  undefined4 in_stack_fffffffffffff90c;
  char *pb;
  CCoinsViewCache *in_stack_fffffffffffff918;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff920;
  undefined4 in_stack_fffffffffffff928;
  int in_stack_fffffffffffff92c;
  CBlockIndex *in_stack_fffffffffffff930;
  undefined4 in_stack_fffffffffffff938;
  int in_stack_fffffffffffff93c;
  AnnotatedMixin<std::recursive_mutex> *in_stack_fffffffffffff940;
  undefined1 *puVar11;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_fffffffffffff948;
  undefined7 in_stack_fffffffffffff950;
  undefined1 in_stack_fffffffffffff957;
  ConstevalStringLiteral in_stack_fffffffffffff958;
  CBlockIndex *in_stack_fffffffffffff960;
  CBlock *in_stack_fffffffffffff968;
  undefined4 in_stack_fffffffffffff970;
  undefined4 in_stack_fffffffffffff974;
  int iVar12;
  int iVar13;
  CCoinsViewCache *in_stack_fffffffffffff978;
  CCoinsViewCache *in_stack_fffffffffffff9a0;
  mapped_type *in_stack_fffffffffffff9a8;
  Chainstate *in_stack_fffffffffffff9b0;
  ConstevalFormatString<2U> in_stack_fffffffffffff9b8;
  undefined7 in_stack_fffffffffffff9c0;
  undefined1 in_stack_fffffffffffff9c7;
  char *in_stack_fffffffffffff9c8;
  size_t in_stack_fffffffffffff9d0;
  mapped_type *pmVar14;
  char *in_stack_fffffffffffff9d8;
  CCoinsViewCache *view;
  CBlockIndex *in_stack_fffffffffffffa00;
  CBlock *in_stack_fffffffffffffa08;
  char *pcVar15;
  Chainstate *in_stack_fffffffffffffa10;
  mapped_type *local_5b0;
  mapped_type *local_5a0;
  byte local_559;
  Level in_stack_fffffffffffffab0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffac0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffac8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_52c [7];
  undefined1 local_448 [40];
  undefined1 local_420 [96];
  undefined1 local_3c0 [96];
  undefined1 local_360 [128];
  undefined1 local_2e0 [208];
  undefined1 local_210 [520];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_fffffffffffff948,in_stack_fffffffffffff940,
             (char *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938),
             (char *)in_stack_fffffffffffff930,in_stack_fffffffffffff92c,
             SUB41((uint)in_stack_fffffffffffff928 >> 0x18,0));
  pCVar4 = (CCoinsViewCache *)CoinsDB((Chainstate *)in_stack_fffffffffffff918);
  view = pCVar4;
  CCoinsViewCache::CCoinsViewCache
            ((CCoinsViewCache *)in_stack_fffffffffffff958.lit,
             (CCoinsView *)CONCAT17(in_stack_fffffffffffff957,in_stack_fffffffffffff950),
             SUB81((ulong)in_stack_fffffffffffff948 >> 0x38,0));
  (*(pCVar4->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView[3])(local_448);
  bVar1 = std::vector<uint256,_std::allocator<uint256>_>::empty
                    ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff918);
  if (bVar1) {
    local_559 = 1;
  }
  else {
    sVar5 = std::vector<uint256,_std::allocator<uint256>_>::size
                      ((vector<uint256,_std::allocator<uint256>_> *)
                       CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908));
    iVar12 = (int)((ulong)in_stack_fffffffffffff978 >> 0x20);
    if (sVar5 == 2) {
      pNVar6 = ChainstateManager::GetNotifications
                         ((ChainstateManager *)
                          CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908));
      ::_(in_stack_fffffffffffff958);
      (*pNVar6->_vptr_Notifications[4])(pNVar6,local_210,0);
      bilingual_str::~bilingual_str
                ((bilingual_str *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908));
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                 (char *)in_stack_fffffffffffff920);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                 (char *)in_stack_fffffffffffff920);
      pb = "Replaying blocks\n";
      in_stack_fffffffffffff908 = 2;
      logging_function_00._M_str = in_stack_fffffffffffff9d8;
      logging_function_00._M_len = in_stack_fffffffffffff9d0;
      source_file_00._M_len._7_1_ = in_stack_fffffffffffff9c7;
      source_file_00._M_len._0_7_ = in_stack_fffffffffffff9c0;
      source_file_00._M_str = in_stack_fffffffffffff9c8;
      LogPrintFormatInternal<>
                (logging_function_00,source_file_00,(int)((ulong)in_stack_fffffffffffff978 >> 0x20),
                 CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                 in_stack_fffffffffffffab0,(ConstevalFormatString<0U>)in_stack_fffffffffffff9b8.fmt)
      ;
      local_5a0 = (mapped_type *)0x0;
      local_5b0 = (mapped_type *)0x0;
      pcVar7 = (char *)(*(long *)(in_RDI + 0x48) + 0x1e0);
      std::vector<uint256,_std::allocator<uint256>_>::operator[]
                ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff918,
                 (size_type)pb);
      sVar8 = std::
              unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
              ::count((unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
                       *)in_stack_fffffffffffff918,(key_type *)pb);
      iVar12 = (int)((ulong)in_stack_fffffffffffff978 >> 0x20);
      if (sVar8 == 0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                   (char *)in_stack_fffffffffffff920);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                   (char *)in_stack_fffffffffffff920);
        in_stack_fffffffffffff908 = 4;
        logging_function_01._M_str = pcVar7;
        logging_function_01._M_len = in_stack_fffffffffffff9d0;
        source_file_01._M_len._7_1_ = in_stack_fffffffffffff9c7;
        source_file_01._M_len._0_7_ = in_stack_fffffffffffff9c0;
        source_file_01._M_str = in_stack_fffffffffffff9c8;
        LogPrintFormatInternal<>
                  (logging_function_01,source_file_01,iVar12,
                   CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                   in_stack_fffffffffffffab0,
                   (ConstevalFormatString<0U>)in_stack_fffffffffffff9b8.fmt);
        local_559 = 0;
      }
      else {
        pcVar9 = (char *)(*(long *)(in_RDI + 0x48) + 0x1e0);
        std::vector<uint256,_std::allocator<uint256>_>::operator[]
                  ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff918,
                   (size_type)pb);
        pmVar10 = std::
                  unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
                  ::operator[]((unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
                                *)in_stack_fffffffffffff918,(key_type *)pb);
        pmVar14 = pmVar10;
        std::vector<uint256,_std::allocator<uint256>_>::operator[]
                  ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff918,
                   (size_type)pb);
        uVar2 = base_blob<256U>::IsNull((base_blob<256U> *)in_stack_fffffffffffff918);
        if (!(bool)uVar2) {
          in_stack_fffffffffffff9b0 = (Chainstate *)(*(long *)(in_RDI + 0x48) + 0x1e0);
          std::vector<uint256,_std::allocator<uint256>_>::operator[]
                    ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff918,
                     (size_type)pb);
          in_stack_fffffffffffff9b8.fmt =
               (char *)std::
                       unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
                       ::count((unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
                                *)in_stack_fffffffffffff918,pb);
          iVar12 = (int)((ulong)in_stack_fffffffffffff978 >> 0x20);
          if (in_stack_fffffffffffff9b8.fmt == (char *)0x0) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                       (char *)in_stack_fffffffffffff920);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                       (char *)in_stack_fffffffffffff920);
            in_stack_fffffffffffff908 = 4;
            logging_function_02._M_str = pcVar7;
            logging_function_02._M_len = (size_t)pmVar14;
            source_file_02._M_len._7_1_ = uVar2;
            source_file_02._M_len._0_7_ = in_stack_fffffffffffff9c0;
            source_file_02._M_str = pcVar9;
            LogPrintFormatInternal<>
                      (logging_function_02,source_file_02,iVar12,
                       CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                       in_stack_fffffffffffffab0,
                       (ConstevalFormatString<0U>)in_stack_fffffffffffff9b8.fmt);
            local_559 = 0;
            goto LAB_007e985b;
          }
          in_stack_fffffffffffff9a0 = (CCoinsViewCache *)(*(long *)(in_RDI + 0x48) + 0x1e0);
          std::vector<uint256,_std::allocator<uint256>_>::operator[]
                    ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff918,
                     (size_type)pb);
          local_5a0 = std::
                      unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
                      ::operator[]((unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
                                    *)in_stack_fffffffffffff918,(key_type *)pb);
          in_stack_fffffffffffff9a8 = local_5a0;
          local_5b0 = LastCommonAncestor((CBlockIndex *)in_stack_fffffffffffff918,(CBlockIndex *)pb)
          ;
          if (local_5b0 == (CBlockIndex *)0x0) {
            __assert_fail("pindexFork != nullptr",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                          ,0x1313,"bool Chainstate::ReplayBlocks()");
          }
        }
        for (; local_5a0 != local_5b0; local_5a0 = local_5a0->pprev) {
          if (0 < local_5a0->nHeight) {
            CBlock::CBlock((CBlock *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
            bVar1 = ::node::BlockManager::ReadBlockFromDisk
                              ((BlockManager *)
                               CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                               in_stack_fffffffffffff968,in_stack_fffffffffffff960);
            if (bVar1) {
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                         (char *)in_stack_fffffffffffff920);
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                         (char *)in_stack_fffffffffffff920);
              CBlockIndex::GetBlockHash((CBlockIndex *)in_stack_fffffffffffff918);
              base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)pb);
              in_stack_fffffffffffff920 =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &local_5a0->nHeight;
              in_stack_fffffffffffff918 = (CCoinsViewCache *)local_2e0;
              pb = "Rolling back %s (%i)\n";
              in_stack_fffffffffffff908 = 2;
              logging_function_04._M_str = pcVar7;
              logging_function_04._M_len = (size_t)pmVar14;
              source_file_04._M_len._7_1_ = uVar2;
              source_file_04._M_len._0_7_ = in_stack_fffffffffffff9c0;
              source_file_04._M_str = pcVar9;
              LogPrintFormatInternal<std::__cxx11::string,int>
                        (logging_function_04,source_file_04,
                         (int)((ulong)in_stack_fffffffffffff978 >> 0x20),
                         CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                         in_stack_fffffffffffffab0,in_stack_fffffffffffff9b8,
                         in_stack_fffffffffffffac0,(int *)in_stack_fffffffffffffac8);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908));
              DVar3 = DisconnectBlock(in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,
                                      in_stack_fffffffffffffa00,view);
              if (DVar3 == DISCONNECT_FAILED) {
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                           (char *)in_stack_fffffffffffff920);
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                           (char *)in_stack_fffffffffffff920);
                pCVar4 = (CCoinsViewCache *)&local_5a0->nHeight;
                CBlockIndex::GetBlockHash((CBlockIndex *)in_stack_fffffffffffff918);
                in_stack_fffffffffffff918 = pCVar4;
                base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)pb);
                in_stack_fffffffffffff920 =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_360 + 0x40);
                pb = "RollbackBlock(): DisconnectBlock failed at %d, hash=%s\n";
                in_stack_fffffffffffff908 = 4;
                logging_function_05._M_str = pcVar7;
                logging_function_05._M_len = (size_t)pmVar14;
                source_file_05._M_len._7_1_ = uVar2;
                source_file_05._M_len._0_7_ = in_stack_fffffffffffff9c0;
                source_file_05._M_str = pcVar9;
                in_stack_fffffffffffff978 = in_stack_fffffffffffff918;
                LogPrintFormatInternal<int,std::__cxx11::string>
                          (logging_function_05,source_file_05,
                           (int)((ulong)in_stack_fffffffffffff918 >> 0x20),
                           CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                           in_stack_fffffffffffffab0,in_stack_fffffffffffff9b8,
                           (int *)in_stack_fffffffffffffac0,in_stack_fffffffffffffac8);
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908));
                local_559 = 0;
                bVar1 = true;
              }
              else {
                bVar1 = false;
              }
            }
            else {
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                         (char *)in_stack_fffffffffffff920);
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                         (char *)in_stack_fffffffffffff920);
              pCVar4 = (CCoinsViewCache *)&local_5a0->nHeight;
              CBlockIndex::GetBlockHash((CBlockIndex *)in_stack_fffffffffffff918);
              base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)pb);
              in_stack_fffffffffffff920 =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_2e0 + 0x40);
              pb = "RollbackBlock(): ReadBlockFromDisk() failed at %d, hash=%s\n";
              in_stack_fffffffffffff908 = 4;
              logging_function_03._M_str = pcVar7;
              logging_function_03._M_len = (size_t)pmVar14;
              source_file_03._M_len._7_1_ = uVar2;
              source_file_03._M_len._0_7_ = in_stack_fffffffffffff9c0;
              source_file_03._M_str = pcVar9;
              LogPrintFormatInternal<int,std::__cxx11::string>
                        (logging_function_03,source_file_03,
                         (int)((ulong)in_stack_fffffffffffff978 >> 0x20),
                         CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                         in_stack_fffffffffffffab0,in_stack_fffffffffffff9b8,
                         (int *)in_stack_fffffffffffffac0,in_stack_fffffffffffffac8);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908));
              local_559 = 0;
              bVar1 = true;
              in_stack_fffffffffffff918 = pCVar4;
            }
            CBlock::~CBlock((CBlock *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908))
            ;
            if (bVar1) goto LAB_007e985b;
          }
        }
        if (local_5b0 == (mapped_type *)0x0) {
          iVar12 = 0;
          local_52c[0]._M_dataplus._M_p._0_4_ = iVar12;
          iVar13 = iVar12;
        }
        else {
          iVar12 = local_5b0->nHeight;
          local_52c[0]._M_dataplus._M_p._0_4_ = iVar12;
          iVar13 = iVar12;
        }
        do {
          local_52c[0]._M_dataplus._M_p._0_4_ = (int)local_52c[0]._M_dataplus._M_p + 1;
          if (pmVar10->nHeight < (int)local_52c[0]._M_dataplus._M_p) {
            CBlockIndex::GetBlockHash((CBlockIndex *)in_stack_fffffffffffff918);
            CCoinsViewCache::SetBestBlock
                      ((CCoinsViewCache *)
                       CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
                       (uint256 *)0x7e97ae);
            CCoinsViewCache::Flush(in_stack_fffffffffffff918);
            pNVar6 = ChainstateManager::GetNotifications
                               ((ChainstateManager *)
                                CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908));
            puVar11 = local_420;
            std::__cxx11::string::string(in_stack_fffffffffffff920);
            std::__cxx11::string::string(in_stack_fffffffffffff920);
            (*pNVar6->_vptr_Notifications[4])(pNVar6,puVar11,100,0);
            bilingual_str::~bilingual_str
                      ((bilingual_str *)
                       CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908));
            local_559 = 1;
            goto LAB_007e985b;
          }
          args_1 = CBlockIndex::GetAncestor(in_stack_fffffffffffff930,in_stack_fffffffffffff92c);
          inline_assertion_check<true,CBlockIndex_const*>
                    ((CBlockIndex **)in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940,
                     in_stack_fffffffffffff93c,(char *)in_stack_fffffffffffff930,
                     (char *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                     (char *)in_stack_fffffffffffff920);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                     (char *)in_stack_fffffffffffff920);
          pcVar15 = "Rolling forward %s (%i)\n";
          CBlockIndex::GetBlockHash((CBlockIndex *)in_stack_fffffffffffff918);
          base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)pb);
          pb = pcVar15;
          in_stack_fffffffffffff920 = local_52c;
          in_stack_fffffffffffff918 = (CCoinsViewCache *)local_360;
          in_stack_fffffffffffff908 = 2;
          logging_function_06._M_str = pcVar7;
          logging_function_06._M_len = (size_t)pmVar14;
          source_file_06._M_len._7_1_ = uVar2;
          source_file_06._M_len._0_7_ = in_stack_fffffffffffff9c0;
          source_file_06._M_str = pcVar9;
          LogPrintFormatInternal<std::__cxx11::string,int>
                    (logging_function_06,source_file_06,
                     (int)((ulong)in_stack_fffffffffffff978 >> 0x20),
                     CONCAT44(iVar12,in_stack_fffffffffffff970),in_stack_fffffffffffffab0,
                     in_stack_fffffffffffff9b8,in_stack_fffffffffffffac0,(int *)args_1);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908));
          str.lit = (char *)ChainstateManager::GetNotifications
                                      ((ChainstateManager *)
                                       CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908)
                                      );
          ::_(str);
          (**(code **)(*(long *)str.lit + 0x20))
                    (str.lit,local_3c0,
                     (int)(((double)((int)local_52c[0]._M_dataplus._M_p - iVar13) * 100.0) /
                          (double)(pmVar10->nHeight - iVar13)),0);
          bilingual_str::~bilingual_str
                    ((bilingual_str *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908))
          ;
          bVar1 = RollforwardBlock(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8,
                                   in_stack_fffffffffffff9a0);
        } while (bVar1);
        local_559 = 0;
      }
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                 (char *)in_stack_fffffffffffff920);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                 (char *)in_stack_fffffffffffff920);
      in_stack_fffffffffffff908 = 4;
      logging_function._M_str = in_stack_fffffffffffff9d8;
      logging_function._M_len = in_stack_fffffffffffff9d0;
      source_file._M_len._7_1_ = in_stack_fffffffffffff9c7;
      source_file._M_len._0_7_ = in_stack_fffffffffffff9c0;
      source_file._M_str = in_stack_fffffffffffff9c8;
      LogPrintFormatInternal<>
                (logging_function,source_file,iVar12,
                 CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                 in_stack_fffffffffffffab0,(ConstevalFormatString<0U>)in_stack_fffffffffffff9b8.fmt)
      ;
      local_559 = 0;
    }
  }
LAB_007e985b:
  std::vector<uint256,_std::allocator<uint256>_>::~vector
            ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff918);
  CCoinsViewCache::~CCoinsViewCache
            ((CCoinsViewCache *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_559 & 1);
}

Assistant:

bool Chainstate::ReplayBlocks()
{
    LOCK(cs_main);

    CCoinsView& db = this->CoinsDB();
    CCoinsViewCache cache(&db);

    std::vector<uint256> hashHeads = db.GetHeadBlocks();
    if (hashHeads.empty()) return true; // We're already in a consistent state.
    if (hashHeads.size() != 2) {
        LogError("ReplayBlocks(): unknown inconsistent state\n");
        return false;
    }

    m_chainman.GetNotifications().progress(_("Replaying blocks…"), 0, false);
    LogPrintf("Replaying blocks\n");

    const CBlockIndex* pindexOld = nullptr;  // Old tip during the interrupted flush.
    const CBlockIndex* pindexNew;            // New tip during the interrupted flush.
    const CBlockIndex* pindexFork = nullptr; // Latest block common to both the old and the new tip.

    if (m_blockman.m_block_index.count(hashHeads[0]) == 0) {
        LogError("ReplayBlocks(): reorganization to unknown block requested\n");
        return false;
    }
    pindexNew = &(m_blockman.m_block_index[hashHeads[0]]);

    if (!hashHeads[1].IsNull()) { // The old tip is allowed to be 0, indicating it's the first flush.
        if (m_blockman.m_block_index.count(hashHeads[1]) == 0) {
            LogError("ReplayBlocks(): reorganization from unknown block requested\n");
            return false;
        }
        pindexOld = &(m_blockman.m_block_index[hashHeads[1]]);
        pindexFork = LastCommonAncestor(pindexOld, pindexNew);
        assert(pindexFork != nullptr);
    }

    // Rollback along the old branch.
    while (pindexOld != pindexFork) {
        if (pindexOld->nHeight > 0) { // Never disconnect the genesis block.
            CBlock block;
            if (!m_blockman.ReadBlockFromDisk(block, *pindexOld)) {
                LogError("RollbackBlock(): ReadBlockFromDisk() failed at %d, hash=%s\n", pindexOld->nHeight, pindexOld->GetBlockHash().ToString());
                return false;
            }
            LogPrintf("Rolling back %s (%i)\n", pindexOld->GetBlockHash().ToString(), pindexOld->nHeight);
            DisconnectResult res = DisconnectBlock(block, pindexOld, cache);
            if (res == DISCONNECT_FAILED) {
                LogError("RollbackBlock(): DisconnectBlock failed at %d, hash=%s\n", pindexOld->nHeight, pindexOld->GetBlockHash().ToString());
                return false;
            }
            // If DISCONNECT_UNCLEAN is returned, it means a non-existing UTXO was deleted, or an existing UTXO was
            // overwritten. It corresponds to cases where the block-to-be-disconnect never had all its operations
            // applied to the UTXO set. However, as both writing a UTXO and deleting a UTXO are idempotent operations,
            // the result is still a version of the UTXO set with the effects of that block undone.
        }
        pindexOld = pindexOld->pprev;
    }

    // Roll forward from the forking point to the new tip.
    int nForkHeight = pindexFork ? pindexFork->nHeight : 0;
    for (int nHeight = nForkHeight + 1; nHeight <= pindexNew->nHeight; ++nHeight) {
        const CBlockIndex& pindex{*Assert(pindexNew->GetAncestor(nHeight))};

        LogPrintf("Rolling forward %s (%i)\n", pindex.GetBlockHash().ToString(), nHeight);
        m_chainman.GetNotifications().progress(_("Replaying blocks…"), (int)((nHeight - nForkHeight) * 100.0 / (pindexNew->nHeight - nForkHeight)), false);
        if (!RollforwardBlock(&pindex, cache)) return false;
    }

    cache.SetBestBlock(pindexNew->GetBlockHash());
    cache.Flush();
    m_chainman.GetNotifications().progress(bilingual_str{}, 100, false);
    return true;
}